

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O3

void __thiscall
OpenMD::RNEMD::SPFMethod::doRNEMDImpl
          (SPFMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  uint *puVar1;
  double *pdVar2;
  int iVar3;
  DataStoragePointer DVar4;
  Molecule *this_00;
  Snapshot *pSVar5;
  RealType RVar6;
  double dVar7;
  StuntDouble *pSVar8;
  uint i_3;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Vector<double,_3U> result_1;
  int selej;
  Vector<double,_3U> result;
  Vector<double,_3U> result_2;
  int selei;
  RealType b;
  RealType a;
  Vector3d v_b;
  Vector3d v_a;
  double local_128 [3];
  int local_10c;
  double local_108 [4];
  double local_e8 [4];
  double local_c8;
  int local_bc;
  double local_b8 [4];
  RealType local_98;
  RealType local_90;
  double local_88;
  double dStack_80;
  double local_78;
  Vector3d local_68;
  Vector3d local_48;
  
  if ((this->super_RNEMD).doRNEMD_ == true) {
    if (this->forceManager_->hasSelectedMolecule_ == false) {
      selectMolecule(this);
    }
    lVar10 = 0;
    if (this->spfTarget_ <= 0.0) {
      do {
        OpenMDBitSet::operator-=
                  ((OpenMDBitSet *)
                   ((long)&(((smanB->ss_).bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar10),
                   (OpenMDBitSet *)
                   ((long)&(((this->selectedMoleculeMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar10));
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0xf0);
    }
    else {
      do {
        OpenMDBitSet::operator-=
                  ((OpenMDBitSet *)
                   ((long)&(((smanA->ss_).bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar10),
                   (OpenMDBitSet *)
                   ((long)&(((this->selectedMoleculeMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar10));
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0xf0);
    }
    (this->smanA_).info_ = smanA->info_;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
              (&(this->smanA_).ss_.bitsets_,&(smanA->ss_).bitsets_);
    std::vector<int,_std::allocator<int>_>::operator=(&(this->smanA_).nObjects_,&smanA->nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator=
              (&(this->smanA_).stuntdoubles_,&smanA->stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator=
              (&(this->smanA_).bonds_,&smanA->bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator=
              (&(this->smanA_).bends_,&smanA->bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator=
              (&(this->smanA_).torsions_,&smanA->torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator=
              (&(this->smanA_).inversions_,&smanA->inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator=
              (&(this->smanA_).molecules_,&smanA->molecules_);
    (this->smanB_).info_ = smanB->info_;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
              (&(this->smanB_).ss_.bitsets_,&(smanB->ss_).bitsets_);
    std::vector<int,_std::allocator<int>_>::operator=(&(this->smanB_).nObjects_,&smanB->nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator=
              (&(this->smanB_).stuntdoubles_,&smanB->stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator=
              (&(this->smanB_).bonds_,&smanB->bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator=
              (&(this->smanB_).bends_,&smanB->bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator=
              (&(this->smanB_).torsions_,&smanB->torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator=
              (&(this->smanB_).inversions_,&smanB->inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator=
              (&(this->smanB_).molecules_,&smanB->molecules_);
    if (this->failedLastTrial_ == false) {
      local_48.super_Vector<double,_3U>.data_[0] = 0.0;
      local_48.super_Vector<double,_3U>.data_[1] = 0.0;
      local_48.super_Vector<double,_3U>.data_[2] = 0.0;
      local_68.super_Vector<double,_3U>.data_[2] = 0.0;
      local_68.super_Vector<double,_3U>.data_[0] = 0.0;
      local_68.super_Vector<double,_3U>.data_[1] = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      isValidExchange(this,&local_48,&local_68,&local_90,&local_98);
      local_bc = 0;
      local_10c = 0;
      pSVar8 = SelectionManager::beginSelected(smanA,&local_bc);
      if (pSVar8 != (StuntDouble *)0x0) {
        local_c8 = local_90;
        do {
          pSVar5 = pSVar8->snapshotMan_->currentSnapshot_;
          lVar10 = (long)pSVar8->localIndex_;
          pdVar2 = (double *)
                   (*(long *)((long)&(pSVar5->atomData).velocity.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar8->storage_) +
                   lVar10 * 0x18);
          local_b8[2] = pdVar2[2];
          local_b8[0] = *pdVar2;
          local_b8[1] = pdVar2[1];
          local_108[0] = 0.0;
          local_108[1] = 0.0;
          local_108[2] = 0.0;
          lVar9 = 0;
          do {
            local_108[lVar9] = local_b8[lVar9] - local_48.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar9 = 0;
          do {
            local_128[lVar9] = local_108[lVar9] * local_c8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          lVar9 = 0;
          do {
            local_e8[lVar9] = local_128[lVar9] + local_48.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_78 = local_e8[2];
          local_88 = local_e8[0];
          dStack_80 = local_e8[1];
          pdVar2[2] = local_e8[2];
          *pdVar2 = local_e8[0];
          pdVar2[1] = local_e8[1];
          if (pSVar8->objType_ - otDAtom < 2) {
            DVar4 = pSVar8->storage_;
            lVar9 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + DVar4);
            local_108[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar10 * 0x18);
            pdVar2 = (double *)(lVar9 + lVar10 * 0x18);
            local_108[0] = *pdVar2;
            local_108[1] = pdVar2[1];
            local_128[0] = 0.0;
            local_128[1] = 0.0;
            local_128[2] = 0.0;
            lVar10 = 0;
            do {
              local_128[lVar10] = local_108[lVar10] * local_c8;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            local_e8[2] = local_128[2];
            local_e8[0] = local_128[0];
            local_e8[1] = local_128[1];
            iVar3 = pSVar8->localIndex_;
            lVar10 = *(long *)((long)&(pSVar8->snapshotMan_->currentSnapshot_->atomData).
                                      angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar4);
            *(double *)(lVar10 + 0x10 + (long)iVar3 * 0x18) = local_128[2];
            pdVar2 = (double *)(lVar10 + (long)iVar3 * 0x18);
            *pdVar2 = local_128[0];
            pdVar2[1] = local_128[1];
          }
          pSVar8 = SelectionManager::nextSelected(smanA,&local_bc);
        } while (pSVar8 != (StuntDouble *)0x0);
      }
      pSVar8 = SelectionManager::beginSelected(smanB,&local_10c);
      if (pSVar8 != (StuntDouble *)0x0) {
        local_c8 = local_98;
        do {
          pSVar5 = pSVar8->snapshotMan_->currentSnapshot_;
          lVar10 = (long)pSVar8->localIndex_;
          pdVar2 = (double *)
                   (*(long *)((long)&(pSVar5->atomData).velocity.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar8->storage_) +
                   lVar10 * 0x18);
          local_b8[2] = pdVar2[2];
          local_b8[0] = *pdVar2;
          local_b8[1] = pdVar2[1];
          local_108[0] = 0.0;
          local_108[1] = 0.0;
          local_108[2] = 0.0;
          lVar9 = 0;
          do {
            local_108[lVar9] = local_b8[lVar9] - local_68.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar9 = 0;
          do {
            local_128[lVar9] = local_108[lVar9] * local_c8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          lVar9 = 0;
          do {
            local_e8[lVar9] = local_128[lVar9] + local_68.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_78 = local_e8[2];
          local_88 = local_e8[0];
          dStack_80 = local_e8[1];
          pdVar2[2] = local_e8[2];
          *pdVar2 = local_e8[0];
          pdVar2[1] = local_e8[1];
          if (pSVar8->objType_ - otDAtom < 2) {
            DVar4 = pSVar8->storage_;
            lVar9 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + DVar4);
            local_108[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar10 * 0x18);
            pdVar2 = (double *)(lVar9 + lVar10 * 0x18);
            local_108[0] = *pdVar2;
            local_108[1] = pdVar2[1];
            local_128[0] = 0.0;
            local_128[1] = 0.0;
            local_128[2] = 0.0;
            lVar10 = 0;
            do {
              local_128[lVar10] = local_108[lVar10] * local_c8;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            local_e8[2] = local_128[2];
            local_e8[0] = local_128[0];
            local_e8[1] = local_128[1];
            iVar3 = pSVar8->localIndex_;
            lVar10 = *(long *)((long)&(pSVar8->snapshotMan_->currentSnapshot_->atomData).
                                      angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar4);
            *(double *)(lVar10 + 0x10 + (long)iVar3 * 0x18) = local_128[2];
            pdVar2 = (double *)(lVar10 + (long)iVar3 * 0x18);
            *pdVar2 = local_128[0];
            pdVar2[1] = local_128[1];
          }
          pSVar8 = SelectionManager::nextSelected(smanB,&local_10c);
        } while (pSVar8 != (StuntDouble *)0x0);
      }
      if ((this->super_RNEMD).useChargedSPF_ == true) {
        this_00 = this->forceManager_->selectedMolecule_;
        if (this_00 == (Molecule *)0x0) {
          uVar11 = 0;
          uVar12 = 0;
        }
        else {
          RVar6 = Molecule::getFixedCharge(this_00);
          uVar11 = SUB84(RVar6,0);
          uVar12 = (undefined4)((ulong)RVar6 >> 0x20);
        }
        dVar7 = (double)CONCAT44(uVar12,uVar11) * this->spfTarget_;
      }
      else {
        dVar7 = this->spfTarget_;
      }
      (this->super_RNEMD).particleExchange_ = dVar7 + (this->super_RNEMD).particleExchange_;
      (this->super_RNEMD).kineticExchange_ =
           (this->super_RNEMD).kineticTarget_ + (this->super_RNEMD).kineticExchange_;
    }
    else {
      puVar1 = &(this->super_RNEMD).failTrialCount_;
      *puVar1 = *puVar1 + 1;
    }
    pSVar5 = (this->super_RNEMD).currentSnap_;
    pSVar5->hasTranslationalKineticEnergy = false;
    pSVar5->hasRotationalKineticEnergy = false;
    pSVar5->hasKineticEnergy = false;
  }
  return;
}

Assistant:

void SPFMethod::doRNEMDImpl(SelectionManager& smanA,
                              SelectionManager& smanB) {
    if (!doRNEMD_) return;

    if (!forceManager_->getHasSelectedMolecule()) { selectMolecule(); }

    // Remove selected molecule from the source selection manager
    if (spfTarget_ > 0.0) {
      smanA -= selectedMoleculeMan_;
    } else {
      smanB -= selectedMoleculeMan_;
    }

    smanA_ = smanA;
    smanB_ = smanB;

    if (!failedLastTrial_) {
      Vector3d v_a {};
      Vector3d v_b {};
      RealType a {0.0};
      RealType b {0.0};

      isValidExchange(v_a, v_b, a, b);

      Vector3d vel;

      int selei {}, selej {};
      StuntDouble* sd;

      for (sd = smanA.beginSelected(selei); sd != NULL;
           sd = smanA.nextSelected(selei)) {
        vel = (sd->getVel() - v_a) * a + v_a;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * a;
          sd->setJ(angMom);
        }
      }

      for (sd = smanB.beginSelected(selej); sd != NULL;
           sd = smanB.nextSelected(selej)) {
        vel = (sd->getVel() - v_b) * b + v_b;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * b;
          sd->setJ(angMom);
        }
      }

      if (useChargedSPF_) {
        RealType fixedChargeOnIon {};

        if (Molecule* selectedMolecule = forceManager_->getSelectedMolecule();
            selectedMolecule) {
          fixedChargeOnIon = selectedMolecule->getFixedCharge();
        }

#ifdef IS_MPI
        MPI_Bcast(&fixedChargeOnIon, 1, MPI_REALTYPE,
                  info_->getMolToProc(currentSnap_->getSPFData()->globalID),
                  MPI_COMM_WORLD);
#endif

        particleExchange_ += spfTarget_ * fixedChargeOnIon;
      } else {
        particleExchange_ += spfTarget_;
      }

      kineticExchange_ += kineticTarget_;
    } else {
      failTrialCount_++;
    }

    currentSnap_->hasTranslationalKineticEnergy = false;
    currentSnap_->hasRotationalKineticEnergy    = false;
    currentSnap_->hasKineticEnergy              = false;
  }